

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O3

int __thiscall CVmObjTable::enable_gc(CVmObjTable *this,int enable)

{
  uint uVar1;
  
  uVar1 = (byte)this->field_0x78 & 1;
  this->field_0x78 = this->field_0x78 & 0xfe | (byte)enable & 1;
  if ((enable != 0) && ((char)uVar1 == '\0')) {
    alloc_check_gc(this,0);
  }
  return uVar1;
}

Assistant:

int CVmObjTable::enable_gc(VMG_ int enable)
{
    /* remember the old status for returning */
    int old_enable = gc_enabled_;

    /* set the new status */
    gc_enabled_ = enable;

    /* 
     *   if we're enabling GC after it was previously disabled, check to
     *   see if we should perform a GC pass now (but don't count this as a
     *   separate allocation) 
     */
    if (!old_enable && enable)
        alloc_check_gc(vmg_ FALSE);

    /* return the previous status */
    return old_enable;
}